

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureglyphcache.cpp
# Opt level: O0

int __thiscall QOpenGLTextureGlyphCache::maxTextureHeight(QOpenGLTextureGlyphCache *this)

{
  long lVar1;
  QOpenGLContextPrivate *pQVar2;
  int *piVar3;
  QTextureGlyphCache *in_RDI;
  long in_FS_OFFSET;
  QOpenGLContext *ctx;
  int local_14;
  int local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = QOpenGLContext::currentContext();
  if (lVar1 == 0) {
    local_14 = QTextureGlyphCache::maxTextureHeight(in_RDI);
  }
  else {
    pQVar2 = QOpenGLContext::d_func((QOpenGLContext *)0x1a4f81);
    if (((byte)pQVar2[0xfd] & 1) == 0) {
      QOpenGLContext::d_func((QOpenGLContext *)0x1a4fc9);
      local_14 = QOpenGLContextPrivate::maxTextureSize();
    }
    else {
      local_10[1] = 0x400;
      QOpenGLContext::d_func((QOpenGLContext *)0x1a4f9c);
      local_10[0] = QOpenGLContextPrivate::maxTextureSize();
      piVar3 = qMin<int>(local_10 + 1,local_10);
      local_14 = *piVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

int QOpenGLTextureGlyphCache::maxTextureHeight() const
{
    QOpenGLContext *ctx = const_cast<QOpenGLContext *>(QOpenGLContext::currentContext());
    if (ctx == nullptr)
        return QImageTextureGlyphCache::maxTextureHeight();

    if (ctx->d_func()->workaround_brokenTexSubImage)
        return qMin(1024, ctx->d_func()->maxTextureSize());
    else
        return ctx->d_func()->maxTextureSize();
}